

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::parseInterfaces(Moc *this,ClassDef *def)

{
  Interface *this_00;
  bool bVar1;
  iterator iVar2;
  pointer pIVar3;
  long lVar4;
  Interface *pIVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined1 local_a8 [40];
  undefined1 *puStack_80;
  undefined1 *local_78;
  QArrayDataPointer<ClassDef::Interface> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(&this->super_Parser,LPAREN);
  this_00 = (Interface *)(local_a8 + 0x20);
  do {
    bVar1 = Parser::test(&this->super_Parser,IDENTIFIER);
    if (!bVar1) {
      Parser::next(&this->super_Parser,PP_RPAREN);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    local_58.d = (Data *)0x0;
    local_58.ptr = (Interface *)0x0;
    local_58.size = 0;
    Parser::lexem((QByteArray *)local_a8,&this->super_Parser);
    ClassDef::Interface::Interface(this_00,(QByteArray *)local_a8);
    QList<ClassDef::Interface>::emplaceBack<ClassDef::Interface>
              ((QList<ClassDef::Interface> *)&local_58,this_00);
    ClassDef::Interface::~Interface(this_00);
    pIVar5 = (Interface *)local_a8;
    while( true ) {
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)pIVar5);
      bVar1 = Parser::test(&this->super_Parser,SCOPE);
      if (!bVar1) break;
      Parser::lexem((QByteArray *)this_00,&this->super_Parser);
      iVar2 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
      QByteArray::append(&iVar2.i[-1].className,(QByteArray *)this_00);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_00);
      Parser::next(&this->super_Parser,IDENTIFIER);
      Parser::lexem((QByteArray *)this_00,&this->super_Parser);
      iVar2 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
      QByteArray::append(&iVar2.i[-1].className,(QByteArray *)this_00);
      pIVar5 = this_00;
    }
    while( true ) {
      bVar1 = Parser::test(&this->super_Parser,COLON);
      if (!bVar1) break;
      Parser::next(&this->super_Parser,IDENTIFIER);
      Parser::lexem((QByteArray *)local_a8,&this->super_Parser);
      ClassDef::Interface::Interface(this_00,(QByteArray *)local_a8);
      QList<ClassDef::Interface>::emplaceBack<ClassDef::Interface>
                ((QList<ClassDef::Interface> *)&local_58,this_00);
      ClassDef::Interface::~Interface(this_00);
      pIVar5 = (Interface *)local_a8;
      while( true ) {
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)pIVar5);
        bVar1 = Parser::test(&this->super_Parser,SCOPE);
        if (!bVar1) break;
        Parser::lexem((QByteArray *)this_00,&this->super_Parser);
        iVar2 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
        QByteArray::append(&iVar2.i[-1].className,(QByteArray *)this_00);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_00);
        Parser::next(&this->super_Parser,IDENTIFIER);
        Parser::lexem((QByteArray *)this_00,&this->super_Parser);
        iVar2 = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)&local_58);
        QByteArray::append(&iVar2.i[-1].className,(QByteArray *)this_00);
        pIVar5 = this_00;
      }
    }
    lVar4 = 0x18;
    for (uVar6 = 0; uVar6 < (ulong)local_58.size; uVar6 = uVar6 + 1) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = (Data *)0x0;
      local_a8._8_8_ = (char *)0x0;
      local_a8._16_8_ = 0;
      QMap<QByteArray,_QByteArray>::value
                ((QByteArray *)this_00,&this->interface2IdMap,
                 (QByteArray *)((long)local_58.ptr + lVar4 + -0x18),(QByteArray *)local_a8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_a8);
      if (local_78 == (undefined1 *)0x0) {
        Parser::error(&this->super_Parser,"Undefined interface");
      }
      pIVar3 = QList<ClassDef::Interface>::data((QList<ClassDef::Interface> *)&local_58);
      QByteArray::operator=
                ((QByteArray *)((long)&(pIVar3->className).d.d + lVar4),(QByteArray *)this_00);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_00);
      lVar4 = lVar4 + 0x30;
    }
    QList<QList<ClassDef::Interface>>::emplaceBack<QList<ClassDef::Interface>const&>
              ((QList<QList<ClassDef::Interface>> *)&def->interfaceList,
               (QList<ClassDef::Interface> *)&local_58);
    QArrayDataPointer<ClassDef::Interface>::~QArrayDataPointer(&local_58);
  } while( true );
}

Assistant:

void Moc::parseInterfaces(ClassDef *def)
{
    next(LPAREN);
    while (test(IDENTIFIER)) {
        QList<ClassDef::Interface> iface;
        iface += ClassDef::Interface(lexem());
        while (test(SCOPE)) {
            iface.last().className += lexem();
            next(IDENTIFIER);
            iface.last().className += lexem();
        }
        while (test(COLON)) {
            next(IDENTIFIER);
            iface += ClassDef::Interface(lexem());
            while (test(SCOPE)) {
                iface.last().className += lexem();
                next(IDENTIFIER);
                iface.last().className += lexem();
            }
        }
        // resolve from classnames to interface ids
        for (qsizetype i = 0; i < iface.size(); ++i) {
            const QByteArray iid = interface2IdMap.value(iface.at(i).className);
            if (iid.isEmpty())
                error("Undefined interface");

            iface[i].interfaceId = iid;
        }
        def->interfaceList += iface;
    }
    next(RPAREN);
}